

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_node4_internal_validate(art_t *art,art_node4_t *node,art_internal_validate_t validator)

{
  _Bool _Var1;
  long in_RSI;
  art_ref_t in_RDI;
  int iVar2;
  art_internal_validate_t in_stack_00000010;
  int j;
  int i;
  int local_20;
  int local_1c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (*(char *)(in_RSI + 6) == '\0') {
    _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,"Node4 has no children");
  }
  else if (*(byte *)(in_RSI + 6) < 5) {
    if (*(char *)(in_RSI + 6) == '\x01') {
      _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                "Node4 and child node should have been combined");
    }
    else {
      iVar2 = (int)in_stack_00000010.context + 1;
      for (local_1c = 0; local_1c < (int)(uint)*(byte *)(in_RSI + 6); local_1c = local_1c + 1) {
        local_20 = local_1c;
        if ((0 < local_1c) &&
           (*(byte *)(in_RSI + 7 + (long)local_1c) <= *(byte *)(in_RSI + 7 + (long)(local_1c + -1)))
           ) {
          _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                    "Node4 keys are not strictly increasing");
          return _Var1;
        }
        while (local_20 = local_20 + 1, local_20 < (int)(uint)*(byte *)(in_RSI + 6)) {
          if (*(long *)(in_RSI + 0x10 + (long)local_1c * 8) ==
              *(long *)(in_RSI + 0x10 + (long)local_20 * 8)) {
            _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                      "Node4 has duplicate children");
            return _Var1;
          }
        }
        (&stack0x00000024)[(int)in_stack_00000010.context + -1] =
             *(undefined1 *)(in_RSI + 7 + (long)local_1c);
        _Var1 = art_internal_validate_at
                          ((art_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           in_RDI,in_stack_00000010);
        if (!_Var1) {
          return false;
        }
      }
      _Var1 = true;
    }
  }
  else {
    _Var1 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                              "Node4 has too many children");
  }
  return _Var1;
}

Assistant:

static bool art_node4_internal_validate(const art_t *art,
                                        const art_node4_t *node,
                                        art_internal_validate_t validator) {
    if (node->count == 0) {
        return art_validate_fail(&validator, "Node4 has no children");
    }
    if (node->count > 4) {
        return art_validate_fail(&validator, "Node4 has too many children");
    }
    if (node->count == 1) {
        return art_validate_fail(
            &validator, "Node4 and child node should have been combined");
    }
    validator.depth++;
    for (int i = 0; i < node->count; ++i) {
        if (i > 0) {
            if (node->keys[i - 1] >= node->keys[i]) {
                return art_validate_fail(
                    &validator, "Node4 keys are not strictly increasing");
            }
        }
        for (int j = i + 1; j < node->count; ++j) {
            if (node->children[i] == node->children[j]) {
                return art_validate_fail(&validator,
                                         "Node4 has duplicate children");
            }
        }
        validator.current_key[validator.depth - 1] = node->keys[i];
        if (!art_internal_validate_at(art, node->children[i], validator)) {
            return false;
        }
    }
    return true;
}